

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerManager.cpp
# Opt level: O0

void __thiscall ztimer::TimerManager::TimerManager(TimerManager *this)

{
  vector<std::unordered_map<unsigned_long,_std::array<unsigned_int,_3UL>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::array<unsigned_int,_3UL>_>_>_>,_std::allocator<std::unordered_map<unsigned_long,_std::array<unsigned_int,_3UL>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::array<unsigned_int,_3UL>_>_>_>_>_>
  *this_00;
  allocator_type *__n;
  allocator_type *in_RDI;
  thread turnThread;
  type *__f;
  type local_9;
  
  *(undefined4 *)in_RDI = 0;
  *(undefined4 *)(in_RDI + 4) = 1000;
  __n = in_RDI + 8;
  this_00 = (vector<std::unordered_map<unsigned_long,_std::array<unsigned_int,_3UL>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::array<unsigned_int,_3UL>_>_>_>,_std::allocator<std::unordered_map<unsigned_long,_std::array<unsigned_int,_3UL>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::array<unsigned_int,_3UL>_>_>_>_>_>
             *)(ulong)*(uint *)(in_RDI + 4);
  __f = &local_9;
  std::
  allocator<std::unordered_map<unsigned_long,_std::array<unsigned_int,_3UL>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::array<unsigned_int,_3UL>_>_>_>_>
  ::allocator((allocator<std::unordered_map<unsigned_long,_std::array<unsigned_int,_3UL>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::array<unsigned_int,_3UL>_>_>_>_>
               *)0x17f943);
  std::
  vector<std::unordered_map<unsigned_long,_std::array<unsigned_int,_3UL>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::array<unsigned_int,_3UL>_>_>_>,_std::allocator<std::unordered_map<unsigned_long,_std::array<unsigned_int,_3UL>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::array<unsigned_int,_3UL>_>_>_>_>_>
  ::vector(this_00,(size_type)__n,in_RDI);
  std::
  allocator<std::unordered_map<unsigned_long,_std::array<unsigned_int,_3UL>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::array<unsigned_int,_3UL>_>_>_>_>
  ::~allocator((allocator<std::unordered_map<unsigned_long,_std::array<unsigned_int,_3UL>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::array<unsigned_int,_3UL>_>_>_>_>
                *)0x17f963);
  std::
  unordered_map<unsigned_long,_unsigned_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>_>
  ::unordered_map((unordered_map<unsigned_long,_unsigned_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>_>
                   *)0x17f976);
  std::
  unordered_map<unsigned_long,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>
  ::unordered_map((unordered_map<unsigned_long,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>
                   *)0x17f989);
  std::mutex::mutex((mutex *)0x17f99a);
  StartTick();
  std::thread::thread<ztimer::TimerManager::TimerManager()::__0,,void>((thread *)in_RDI,__f);
  std::thread::detach();
  std::thread::~thread((thread *)0x17f9d2);
  return;
}

Assistant:

TimerManager::TimerManager() : pin(0), timeWheelPeriod(1000), timeWheel(timeWheelPeriod)
    {
        StartTick();
        std::thread turnThread([&]() {
            while (1) {
                {
                    std::unique_lock<std::mutex> lk(tickMtx);
                    cv.wait(lk, []() { return tick; });
                    tick = false;
                }
                std::lock_guard<std::mutex> lk(mtx);
                pin++;
                pin = (pin == timeWheelPeriod ? 0 : pin);
                Turn(pin);
            }
        });
        turnThread.detach();
    }